

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerPlaybackSavepoint(Pager *pPager,PagerSavepoint *pSavepoint)

{
  bool bVar1;
  long local_68;
  u32 local_5c;
  long local_58;
  i64 offset;
  u32 ii_1;
  u32 dummy;
  u32 nJRec;
  u32 ii;
  Bitvec *pDone;
  long lStack_30;
  int rc;
  i64 iHdrOff;
  i64 szJ;
  PagerSavepoint *pSavepoint_local;
  Pager *pPager_local;
  
  pDone._4_4_ = 0;
  _nJRec = (Bitvec *)0x0;
  szJ = (i64)pSavepoint;
  pSavepoint_local = (PagerSavepoint *)pPager;
  if ((pSavepoint == (PagerSavepoint *)0x0) ||
     (_nJRec = sqlite3BitvecCreate(pSavepoint->nOrig), _nJRec != (Bitvec *)0x0)) {
    if (szJ == 0) {
      local_5c = pSavepoint_local->aWalData[0];
    }
    else {
      local_5c = *(u32 *)(szJ + 0x18);
    }
    pSavepoint_local->iSubRec = local_5c;
    *(undefined1 *)((long)&pSavepoint_local->pInSavepoint + 6) =
         *(undefined1 *)&pSavepoint_local->pInSavepoint;
    if ((szJ == 0) && (pSavepoint_local[6].iOffset != 0)) {
      pPager_local._4_4_ = pagerRollbackWal((Pager *)pSavepoint_local);
    }
    else {
      iHdrOff = pSavepoint_local[2].iOffset;
      if ((szJ == 0) || (pSavepoint_local[6].iOffset != 0)) {
        pSavepoint_local[2].iOffset = 0;
      }
      else {
        local_68 = iHdrOff;
        if (*(long *)(szJ + 8) != 0) {
          local_68 = *(long *)(szJ + 8);
        }
        lStack_30 = local_68;
        pSavepoint_local[2].iOffset = *(i64 *)szJ;
        while( true ) {
          bVar1 = false;
          if (pDone._4_4_ == 0) {
            bVar1 = pSavepoint_local[2].iOffset < lStack_30;
          }
          if (!bVar1) break;
          pDone._4_4_ = pager_playback_one_page
                                  ((Pager *)pSavepoint_local,&pSavepoint_local[2].iOffset,_nJRec,1,1
                                  );
        }
      }
      while( true ) {
        bVar1 = false;
        if (pDone._4_4_ == 0) {
          bVar1 = pSavepoint_local[2].iOffset < iHdrOff;
        }
        if (!bVar1) break;
        ii_1 = 0;
        pDone._4_4_ = readJournalHdr((Pager *)pSavepoint_local,0,iHdrOff,&ii_1,
                                     (u32 *)((long)&offset + 4));
        if ((ii_1 == 0) &&
           (pSavepoint_local[2].iHdrOffset + (ulong)pSavepoint_local[3].aWalData[2] ==
            pSavepoint_local[2].iOffset)) {
          ii_1 = (u32)((iHdrOff - pSavepoint_local[2].iOffset) /
                      (long)(int)(pSavepoint_local[3].aWalData[3] + 8));
        }
        dummy = 0;
        while( true ) {
          bVar1 = false;
          if ((pDone._4_4_ == 0) && (bVar1 = false, dummy < ii_1)) {
            bVar1 = pSavepoint_local[2].iOffset < iHdrOff;
          }
          if (!bVar1) break;
          pDone._4_4_ = pager_playback_one_page
                                  ((Pager *)pSavepoint_local,&pSavepoint_local[2].iOffset,_nJRec,1,1
                                  );
          dummy = dummy + 1;
        }
      }
      if (szJ != 0) {
        local_58 = (ulong)*(uint *)(szJ + 0x1c) * (long)(int)(pSavepoint_local[3].aWalData[3] + 4);
        if (pSavepoint_local[6].iOffset != 0) {
          pDone._4_4_ = sqlite3WalSavepointUndo
                                  ((Wal *)pSavepoint_local[6].iOffset,(u32 *)(szJ + 0x20));
        }
        offset._0_4_ = *(uint *)(szJ + 0x1c);
        while( true ) {
          bVar1 = false;
          if (pDone._4_4_ == 0) {
            bVar1 = (uint)offset < (uint)pSavepoint_local[1].iHdrOffset;
          }
          if (!bVar1) break;
          pDone._4_4_ = pager_playback_one_page((Pager *)pSavepoint_local,&local_58,_nJRec,0,1);
          offset._0_4_ = (uint)offset + 1;
        }
      }
      sqlite3BitvecDestroy(_nJRec);
      if (pDone._4_4_ == 0) {
        pSavepoint_local[2].iOffset = iHdrOff;
      }
      pPager_local._4_4_ = pDone._4_4_;
    }
  }
  else {
    pPager_local._4_4_ = 7;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pagerPlaybackSavepoint(Pager *pPager, PagerSavepoint *pSavepoint){
  i64 szJ;                 /* Effective size of the main journal */
  i64 iHdrOff;             /* End of first segment of main-journal records */
  int rc = SQLITE_OK;      /* Return code */
  Bitvec *pDone = 0;       /* Bitvec to ensure pages played back only once */

  assert( pPager->eState!=PAGER_ERROR );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );

  /* Allocate a bitvec to use to store the set of pages rolled back */
  if( pSavepoint ){
    pDone = sqlite3BitvecCreate(pSavepoint->nOrig);
    if( !pDone ){
      return SQLITE_NOMEM_BKPT;
    }
  }

  /* Set the database size back to the value it was before the savepoint 
  ** being reverted was opened.
  */
  pPager->dbSize = pSavepoint ? pSavepoint->nOrig : pPager->dbOrigSize;
  pPager->changeCountDone = pPager->tempFile;

  if( !pSavepoint && pagerUseWal(pPager) ){
    return pagerRollbackWal(pPager);
  }

  /* Use pPager->journalOff as the effective size of the main rollback
  ** journal.  The actual file might be larger than this in
  ** PAGER_JOURNALMODE_TRUNCATE or PAGER_JOURNALMODE_PERSIST.  But anything
  ** past pPager->journalOff is off-limits to us.
  */
  szJ = pPager->journalOff;
  assert( pagerUseWal(pPager)==0 || szJ==0 );

  /* Begin by rolling back records from the main journal starting at
  ** PagerSavepoint.iOffset and continuing to the next journal header.
  ** There might be records in the main journal that have a page number
  ** greater than the current database size (pPager->dbSize) but those
  ** will be skipped automatically.  Pages are added to pDone as they
  ** are played back.
  */
  if( pSavepoint && !pagerUseWal(pPager) ){
    iHdrOff = pSavepoint->iHdrOffset ? pSavepoint->iHdrOffset : szJ;
    pPager->journalOff = pSavepoint->iOffset;
    while( rc==SQLITE_OK && pPager->journalOff<iHdrOff ){
      rc = pager_playback_one_page(pPager, &pPager->journalOff, pDone, 1, 1);
    }
    assert( rc!=SQLITE_DONE );
  }else{
    pPager->journalOff = 0;
  }

  /* Continue rolling back records out of the main journal starting at
  ** the first journal header seen and continuing until the effective end
  ** of the main journal file.  Continue to skip out-of-range pages and
  ** continue adding pages rolled back to pDone.
  */
  while( rc==SQLITE_OK && pPager->journalOff<szJ ){
    u32 ii;            /* Loop counter */
    u32 nJRec = 0;     /* Number of Journal Records */
    u32 dummy;
    rc = readJournalHdr(pPager, 0, szJ, &nJRec, &dummy);
    assert( rc!=SQLITE_DONE );

    /*
    ** The "pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff"
    ** test is related to ticket #2565.  See the discussion in the
    ** pager_playback() function for additional information.
    */
    if( nJRec==0 
     && pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff
    ){
      nJRec = (u32)((szJ - pPager->journalOff)/JOURNAL_PG_SZ(pPager));
    }
    for(ii=0; rc==SQLITE_OK && ii<nJRec && pPager->journalOff<szJ; ii++){
      rc = pager_playback_one_page(pPager, &pPager->journalOff, pDone, 1, 1);
    }
    assert( rc!=SQLITE_DONE );
  }
  assert( rc!=SQLITE_OK || pPager->journalOff>=szJ );

  /* Finally,  rollback pages from the sub-journal.  Page that were
  ** previously rolled back out of the main journal (and are hence in pDone)
  ** will be skipped.  Out-of-range pages are also skipped.
  */
  if( pSavepoint ){
    u32 ii;            /* Loop counter */
    i64 offset = (i64)pSavepoint->iSubRec*(4+pPager->pageSize);

    if( pagerUseWal(pPager) ){
      rc = sqlite3WalSavepointUndo(pPager->pWal, pSavepoint->aWalData);
    }
    for(ii=pSavepoint->iSubRec; rc==SQLITE_OK && ii<pPager->nSubRec; ii++){
      assert( offset==(i64)ii*(4+pPager->pageSize) );
      rc = pager_playback_one_page(pPager, &offset, pDone, 0, 1);
    }
    assert( rc!=SQLITE_DONE );
  }

  sqlite3BitvecDestroy(pDone);
  if( rc==SQLITE_OK ){
    pPager->journalOff = szJ;
  }

  return rc;
}